

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O1

long __thiscall
duckdb::DateDiffTernaryOperator::Operation<duckdb::string_t,duckdb::date_t,duckdb::date_t,long>
          (DateDiffTernaryOperator *this,string_t part,date_t startdate,date_t enddate,
          ValidityMask *mask,idx_t idx)

{
  _Head_base<0UL,_unsigned_long_*,_false> this_00;
  byte bVar1;
  _Head_base<0UL,_unsigned_long_*,_false> *p_Var2;
  uint uVar3;
  _Alloc_hider _Var4;
  size_type sVar5;
  bool bVar6;
  DatePartSpecifier DVar7;
  int32_t iVar8;
  int32_t iVar9;
  int iVar10;
  TemplatedValidityData<unsigned_long> *pTVar11;
  long lVar12;
  int64_t iVar13;
  ulong uVar14;
  NotImplementedException *this_01;
  int iVar15;
  date_t input;
  uint uVar16;
  ulong uVar17;
  undefined4 in_register_00000084;
  int64_t iVar18;
  long lVar19;
  int32_t end_month;
  int32_t end_year;
  int32_t start_month;
  int32_t end_day;
  int32_t start_day;
  int32_t start_year;
  date_t in_stack_ffffffffffffff6c;
  int local_8c;
  int local_88;
  int local_84;
  int32_t local_80;
  int32_t local_7c;
  string local_78;
  undefined8 local_58;
  long local_50;
  string local_48;
  
  local_50 = part.value._0_8_;
  p_Var2 = (_Head_base<0UL,_unsigned_long_*,_false> *)CONCAT44(in_register_00000084,enddate.days);
  input.days = part.value._8_4_;
  local_58 = this;
  bVar6 = Value::IsFinite<duckdb::date_t>(input);
  if ((!bVar6) || (bVar6 = Value::IsFinite<duckdb::date_t>(startdate), !bVar6)) {
    if (p_Var2->_M_head_impl == (unsigned_long *)0x0) {
      local_48._M_dataplus._M_p = (pointer)p_Var2[3]._M_head_impl;
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_78,(unsigned_long *)&local_48);
      sVar5 = local_78._M_string_length;
      _Var4._M_p = local_78._M_dataplus._M_p;
      local_78._M_dataplus._M_p = (pointer)0x0;
      local_78._M_string_length = 0;
      this_00._M_head_impl = p_Var2[2]._M_head_impl;
      p_Var2[1]._M_head_impl = (unsigned_long *)_Var4._M_p;
      p_Var2[2]._M_head_impl = (unsigned_long *)sVar5;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_head_impl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_00._M_head_impl);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._M_string_length);
      }
      pTVar11 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                          ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                           (p_Var2 + 1));
      p_Var2->_M_head_impl =
           (pTVar11->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
    }
    bVar1 = (byte)mask & 0x3f;
    p_Var2->_M_head_impl[(ulong)mask >> 6] =
         p_Var2->_M_head_impl[(ulong)mask >> 6] &
         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    return 0;
  }
  lVar12 = local_50;
  if (((ulong)local_58 & 0xffffffff) < 0xd) {
    lVar12 = (long)&local_58 + 4;
  }
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,lVar12,((ulong)local_58 & 0xffffffff) + lVar12);
  DVar7 = GetDatePartSpecifier(&local_48);
  switch(DVar7) {
  case BEGIN_BIGINT:
    iVar8 = Date::ExtractYear(in_stack_ffffffffffffff6c);
    iVar15 = Date::ExtractYear(in_stack_ffffffffffffff6c);
    goto LAB_019f71ea;
  case MONTH:
    Date::Convert(input,(int32_t *)&local_78,&local_84,&local_7c);
    Date::Convert(startdate,&local_88,&local_8c,&local_80);
    lVar12 = (long)((local_8c - local_84) + (local_88 - (int)local_78._M_dataplus._M_p) * 0xc);
    goto LAB_019f71ef;
  case DAY:
  case DOW:
  case ISODOW:
  case DOY:
  case JULIAN_DAY:
    iVar8 = Date::EpochDays(startdate);
    iVar9 = Date::EpochDays(input);
    iVar18 = (int64_t)iVar8;
    lVar12 = (long)iVar9;
    break;
  case DECADE:
    iVar8 = Date::ExtractYear(in_stack_ffffffffffffff6c);
    iVar9 = Date::ExtractYear(in_stack_ffffffffffffff6c);
    iVar15 = iVar8 / 10;
    uVar3 = (uint)((ulong)((long)iVar9 * -0x66666667) >> 0x20);
    uVar16 = uVar3 >> 0x1f;
    iVar10 = (int)uVar3 >> 2;
    goto LAB_019f71d1;
  case CENTURY:
    iVar8 = Date::ExtractYear(in_stack_ffffffffffffff6c);
    iVar9 = Date::ExtractYear(in_stack_ffffffffffffff6c);
    iVar15 = iVar8 / 100;
    uVar3 = (uint)((ulong)((long)iVar9 * -0x51eb851f) >> 0x20);
    uVar16 = uVar3 >> 0x1f;
    iVar10 = (int)uVar3 >> 5;
    goto LAB_019f71d1;
  case MILLENNIUM:
    iVar8 = Date::ExtractYear(in_stack_ffffffffffffff6c);
    iVar9 = Date::ExtractYear(in_stack_ffffffffffffff6c);
    iVar15 = iVar8 / 1000;
    uVar3 = (uint)((ulong)((long)iVar9 * -0x10624dd3) >> 0x20);
    uVar16 = uVar3 >> 0x1f;
    iVar10 = (int)uVar3 >> 6;
LAB_019f71d1:
    iVar15 = iVar10 + uVar16 + iVar15;
LAB_019f71d5:
    lVar12 = (long)iVar15;
    goto LAB_019f71ef;
  case MICROSECONDS:
    iVar18 = Date::EpochMicroseconds(startdate);
    lVar12 = Date::EpochMicroseconds(input);
    break;
  case MILLISECONDS:
    iVar18 = Date::EpochMicroseconds(startdate);
    iVar13 = Date::EpochMicroseconds(input);
    lVar12 = iVar18 / 1000;
    uVar17 = SUB168(SEXT816(iVar13) * SEXT816(-0x20c49ba5e353f7cf),8);
    uVar14 = uVar17 >> 0x3f;
    lVar19 = (long)uVar17 >> 7;
    goto LAB_019f7132;
  case SECOND:
  case BEGIN_DOUBLE:
    iVar18 = Date::Epoch(startdate);
    lVar12 = Date::Epoch(input);
    break;
  case MINUTE:
    iVar18 = Date::Epoch(startdate);
    iVar13 = Date::Epoch(input);
    lVar12 = iVar18 / 0x3c;
    uVar17 = SUB168(SEXT816(iVar13) * SEXT816(0x7777777777777777),8) - iVar13;
    uVar14 = uVar17 >> 0x3f;
    lVar19 = (long)uVar17 >> 5;
    goto LAB_019f7132;
  case HOUR:
    iVar18 = Date::Epoch(startdate);
    iVar13 = Date::Epoch(input);
    lVar12 = iVar18 / 0xe10;
    uVar17 = SUB168(SEXT816(iVar13) * SEXT816(-0x48d159e26af37c05),8);
    uVar14 = uVar17 >> 0x3f;
    lVar19 = (long)uVar17 >> 10;
LAB_019f7132:
    lVar12 = lVar19 + uVar14 + lVar12;
    goto LAB_019f71ef;
  case WEEK:
  case YEARWEEK:
    iVar15 = (startdate.days - input.days) / 7;
    goto LAB_019f71d5;
  case ISOYEAR:
    iVar8 = Date::ExtractISOYearNumber(startdate);
    iVar15 = Date::ExtractISOYearNumber(input);
LAB_019f71ea:
    lVar12 = (long)(iVar8 - iVar15);
    goto LAB_019f71ef;
  case QUARTER:
    Date::Convert(input,(int32_t *)&local_78,&local_84,&local_7c);
    Date::Convert(startdate,&local_88,&local_8c,&local_80);
    iVar15 = local_84 + (int)local_78._M_dataplus._M_p * 0xc + -1;
    iVar15 = (int)((ulong)((long)iVar15 * 0x55555555) >> 0x20) - iVar15;
    lVar12 = (long)(((iVar15 >> 1) - (iVar15 >> 0x1f)) + (local_8c + local_88 * 0xc + -1) / 3);
    goto LAB_019f71ef;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_78,"Specifier type not implemented for DATEDIFF","");
    NotImplementedException::NotImplementedException(this_01,&local_78);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar12 = iVar18 - lVar12;
LAB_019f71ef:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return lVar12;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}